

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_7.cpp
# Opt level: O3

string_view trim(string_view s)

{
  void *pvVar1;
  size_type sVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  string_view sVar7;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  uVar5 = s._M_len;
  uVar3 = 0xffffffffffffffff;
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      pvVar1 = memchr(" \t\r\v\n",(int)s._M_str[uVar6],5);
      uVar3 = uVar6;
      if (pvVar1 == (void *)0x0) break;
      uVar6 = uVar6 + 1;
      uVar3 = 0xffffffffffffffff;
    } while (uVar5 != uVar6);
  }
  if (uVar5 <= uVar3) {
    uVar3 = uVar5;
  }
  local_38._M_str = s._M_str + uVar3;
  local_38._M_len = uVar5 - uVar3;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                    (&local_38," \t\r\v\n",0xffffffffffffffff,5);
  uVar3 = ~sVar2 + (uVar5 - uVar3);
  sVar4 = 0;
  if (uVar3 <= local_38._M_len) {
    sVar4 = local_38._M_len - uVar3;
  }
  sVar7._M_str = local_38._M_str;
  sVar7._M_len = sVar4;
  return sVar7;
}

Assistant:

string_view trim(string_view s)
{
	s.remove_prefix(min(s.find_first_not_of(" \t\r\v\n"), s.size()));
	s.remove_suffix(min(s.size() - s.find_last_not_of(" \t\r\v\n") - 1, s.size()));
	return s;
}